

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshManipulator.cpp
# Opt level: O1

SMesh * __thiscall irr::scene::CMeshManipulator::createMeshCopy(CMeshManipulator *this,IMesh *mesh)

{
  pointer *ppSVar1;
  _func_int *p_Var2;
  iterator __position;
  iterator iVar3;
  iterator __position_00;
  iterator __position_01;
  undefined8 uVar4;
  E_MATERIAL_TYPE EVar5;
  u32 uVar6;
  u32 uVar7;
  E_TEXTURE_MIN_FILTER EVar8;
  E_TEXTURE_MAG_FILTER EVar9;
  f32 fVar10;
  f32 fVar11;
  f32 fVar12;
  undefined4 uVar13;
  f32 fVar14;
  f32 fVar15;
  f32 fVar16;
  vector2df vVar17;
  undefined8 uVar18;
  float fVar19;
  SColor SVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int iVar29;
  uint uVar30;
  undefined4 extraout_var;
  CMeshBuffer<irr::video::S3DVertex> *this_00;
  SMaterialLayer *pSVar32;
  S3DVertex *__args;
  unsigned_short *puVar33;
  S3DVertex2TCoords *__args_00;
  S3DVertexTangents *__args_01;
  undefined8 *puVar34;
  CMeshBuffer<irr::video::S3DVertex> *pCVar35;
  SMaterialLayer *pSVar36;
  _func_int *p_Var37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  CMeshBuffer<irr::video::S3DVertex> *local_60;
  array<irr::scene::IMeshBuffer_*> *local_58;
  IMesh *local_50;
  uint local_44;
  SMesh *local_40;
  aabbox3d<float> *local_38;
  long *plVar31;
  undefined4 extraout_var_00;
  
  if (mesh == (IMesh *)0x0) {
    return (SMesh *)0x0;
  }
  local_40 = (SMesh *)operator_new(0x58);
  uVar39 = 0;
  *(undefined8 *)&local_40->field_0x48 = 0;
  *(undefined4 *)&local_40->field_0x50 = 1;
  (local_40->super_IMesh)._vptr_IMesh = (_func_int **)&PTR_getMeshBufferCount_00262e90;
  *(undefined ***)&local_40->field_0x40 = &PTR__SMesh_00262f00;
  *(undefined8 *)&(local_40->super_IMesh).field_0x8 = 0;
  *(undefined8 *)&(local_40->super_IMesh).field_0x10 = 0;
  *(undefined8 *)&(local_40->super_IMesh).field_0x18 = 0;
  local_40->field_0x20 = 1;
  local_38 = &local_40->BoundingBox;
  (local_40->BoundingBox).MinEdge.X = -1.0;
  (local_40->BoundingBox).MinEdge.Y = -1.0;
  *(undefined8 *)&(local_40->BoundingBox).MinEdge.Z = 0x3f800000bf800000;
  (local_40->BoundingBox).MaxEdge.Y = 1.0;
  (local_40->BoundingBox).MaxEdge.Z = 1.0;
  local_44 = (**mesh->_vptr_IMesh)(mesh);
  if (local_44 != 0) {
    local_58 = (array<irr::scene::IMeshBuffer_*> *)&(local_40->super_IMesh).field_0x8;
    local_50 = mesh;
    do {
      iVar29 = (*mesh->_vptr_IMesh[1])(mesh,uVar39);
      plVar31 = (long *)CONCAT44(extraout_var,iVar29);
      iVar29 = (**(code **)(*plVar31 + 0x10))(plVar31);
      if (iVar29 == 2) {
        this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
        CMeshBuffer<irr::video::S3DVertexTangents>::CMeshBuffer
                  ((CMeshBuffer<irr::video::S3DVertexTangents> *)this_00);
        pSVar32 = (SMaterialLayer *)(**(code **)(*plVar31 + 8))(plVar31);
        lVar40 = 4;
        pSVar36 = pSVar32;
        pCVar35 = this_00;
        do {
          pCVar35 = (CMeshBuffer<irr::video::S3DVertex> *)&pCVar35->Material;
          video::SMaterialLayer::operator=((SMaterialLayer *)pCVar35,pSVar36);
          pSVar36 = pSVar36 + 1;
          lVar40 = lVar40 + -1;
        } while (lVar40 != 0);
        *(short *)&(this_00->Material).field_0xb0 = (short)pSVar32[5].MagFilter;
        EVar5 = *(E_MATERIAL_TYPE *)&pSVar32[4].Texture;
        uVar6 = *(u32 *)((long)&pSVar32[4].Texture + 4);
        uVar7 = *(u32 *)&pSVar32[4].field_0x8;
        EVar8 = pSVar32[4].MinFilter;
        EVar9 = pSVar32[4].MagFilter;
        fVar10 = *(f32 *)&pSVar32[4].AnisotropicFilter;
        fVar11 = *(f32 *)&pSVar32[4].TextureMatrix;
        fVar12 = *(f32 *)((long)&pSVar32[4].TextureMatrix + 4);
        uVar13 = *(undefined4 *)&pSVar32[5].Texture;
        fVar14 = *(f32 *)((long)&pSVar32[5].Texture + 4);
        fVar15 = *(f32 *)&pSVar32[5].field_0x8;
        fVar16 = (f32)pSVar32[5].MinFilter;
        (this_00->Material).ZBuffer = (char)uVar13;
        (this_00->Material).AntiAliasing = (char)((uint)uVar13 >> 8);
        *(short *)&(this_00->Material).field_0xa2 = (short)((uint)uVar13 >> 0x10);
        (this_00->Material).BlendFactor = fVar14;
        (this_00->Material).PolygonOffsetDepthBias = fVar15;
        (this_00->Material).PolygonOffsetSlopeScale = fVar16;
        (this_00->Material).SpecularColor.color = EVar9;
        (this_00->Material).Shininess = fVar10;
        (this_00->Material).MaterialTypeParam = fVar11;
        (this_00->Material).Thickness = fVar12;
        (this_00->Material).MaterialType = EVar5;
        (this_00->Material).AmbientColor.color = uVar6;
        (this_00->Material).DiffuseColor.color = uVar7;
        (this_00->Material).EmissiveColor.color = EVar8;
        uVar30 = (**(code **)(*plVar31 + 0x28))(plVar31);
        core::array<irr::video::S3DVertexTangents>::reallocate
                  ((array<irr::video::S3DVertexTangents> *)&this_00->Vertices,uVar30,true);
        __args_01 = (S3DVertexTangents *)(**(code **)(*plVar31 + 0x18))(plVar31);
        if (uVar30 != 0) {
          uVar38 = (ulong)uVar30;
          do {
            __position_01._M_current =
                 (S3DVertexTangents *)
                 (this_00->Vertices).m_data.
                 super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position_01._M_current ==
                (S3DVertexTangents *)
                (this_00->Vertices).m_data.
                super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<irr::video::S3DVertexTangents,std::allocator<irr::video::S3DVertexTangents>>::
              _M_realloc_insert<irr::video::S3DVertexTangents_const&>
                        ((vector<irr::video::S3DVertexTangents,std::allocator<irr::video::S3DVertexTangents>>
                          *)&this_00->Vertices,__position_01,__args_01);
            }
            else {
              fVar27 = (__args_01->super_S3DVertex).Pos.X;
              fVar28 = (__args_01->super_S3DVertex).Pos.Y;
              uVar4 = *(undefined8 *)&(__args_01->super_S3DVertex).Pos.Z;
              fVar24 = (__args_01->super_S3DVertex).Normal.Y;
              fVar25 = (__args_01->super_S3DVertex).Normal.Z;
              SVar20.color = (__args_01->super_S3DVertex).Color.color;
              fVar26 = (__args_01->super_S3DVertex).TCoords.X;
              uVar18 = *(undefined8 *)&(__args_01->super_S3DVertex).TCoords.Y;
              fVar22 = (__args_01->Tangent).Y;
              fVar23 = (__args_01->Tangent).Z;
              fVar19 = (__args_01->Binormal).Y;
              fVar21 = (__args_01->Binormal).Z;
              *(undefined8 *)&((__position_01._M_current)->Tangent).Z =
                   *(undefined8 *)&(__args_01->Tangent).Z;
              ((__position_01._M_current)->Binormal).Y = fVar19;
              ((__position_01._M_current)->Binormal).Z = fVar21;
              *(undefined8 *)&((__position_01._M_current)->super_S3DVertex).TCoords.Y = uVar18;
              ((__position_01._M_current)->Tangent).Y = fVar22;
              ((__position_01._M_current)->Tangent).Z = fVar23;
              ((__position_01._M_current)->super_S3DVertex).Normal.Y = fVar24;
              ((__position_01._M_current)->super_S3DVertex).Normal.Z = fVar25;
              ((__position_01._M_current)->super_S3DVertex).Color = (SColor)SVar20.color;
              ((__position_01._M_current)->super_S3DVertex).TCoords.X = fVar26;
              ((__position_01._M_current)->super_S3DVertex).Pos.X = fVar27;
              ((__position_01._M_current)->super_S3DVertex).Pos.Y = fVar28;
              *(undefined8 *)&((__position_01._M_current)->super_S3DVertex).Pos.Z = uVar4;
              ppSVar1 = &(this_00->Vertices).m_data.
                         super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppSVar1 = (pointer)&(*ppSVar1)[1].Color;
            }
            (this_00->Vertices).is_sorted = false;
            __args_01 = __args_01 + 1;
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
        uVar30 = (**(code **)(*plVar31 + 0x48))(plVar31);
        core::array<unsigned_short>::reallocate(&this_00->Indices,uVar30,true);
        puVar33 = (unsigned_short *)(**(code **)(*plVar31 + 0x38))(plVar31);
        if (uVar30 != 0) {
          uVar38 = (ulong)uVar30;
          do {
            iVar3._M_current =
                 (this_00->Indices).m_data.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this_00->Indices).m_data.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>
                        ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this_00->Indices,
                         iVar3,puVar33);
            }
            else {
              *iVar3._M_current = *puVar33;
              (this_00->Indices).m_data.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            (this_00->Indices).is_sorted = false;
            puVar33 = puVar33 + 1;
            uVar38 = uVar38 - 1;
          } while (uVar38 != 0);
        }
LAB_001c4499:
        p_Var2 = (this_00->super_IMeshBuffer)._vptr_IMeshBuffer[-3] +
                 (long)((this_00->Material).TextureLayers + -1) + 0x10;
        *(int *)p_Var2 = *(int *)p_Var2 + 1;
        local_60 = this_00;
        core::array<irr::scene::IMeshBuffer_*>::push_back(local_58,(IMeshBuffer **)&local_60);
        mesh = local_50;
        p_Var37 = (this_00->super_IMeshBuffer)._vptr_IMeshBuffer[-3];
        p_Var2 = p_Var37 + (long)((this_00->Material).TextureLayers + -1) + 0x10;
        *(int *)p_Var2 = *(int *)p_Var2 + -1;
        if (*(int *)p_Var2 == 0) {
          p_Var37 = p_Var37 + (long)((this_00->Material).TextureLayers + -1);
          (**(code **)(*(long *)p_Var37 + 8))(p_Var37);
        }
      }
      else {
        if (iVar29 == 1) {
          this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
          CMeshBuffer<irr::video::S3DVertex2TCoords>::CMeshBuffer
                    ((CMeshBuffer<irr::video::S3DVertex2TCoords> *)this_00);
          pSVar32 = (SMaterialLayer *)(**(code **)(*plVar31 + 8))(plVar31);
          lVar40 = 4;
          pSVar36 = pSVar32;
          pCVar35 = this_00;
          do {
            pCVar35 = (CMeshBuffer<irr::video::S3DVertex> *)&pCVar35->Material;
            video::SMaterialLayer::operator=((SMaterialLayer *)pCVar35,pSVar36);
            pSVar36 = pSVar36 + 1;
            lVar40 = lVar40 + -1;
          } while (lVar40 != 0);
          *(short *)&(this_00->Material).field_0xb0 = (short)pSVar32[5].MagFilter;
          EVar5 = *(E_MATERIAL_TYPE *)&pSVar32[4].Texture;
          uVar6 = *(u32 *)((long)&pSVar32[4].Texture + 4);
          uVar7 = *(u32 *)&pSVar32[4].field_0x8;
          EVar8 = pSVar32[4].MinFilter;
          EVar9 = pSVar32[4].MagFilter;
          fVar10 = *(f32 *)&pSVar32[4].AnisotropicFilter;
          fVar11 = *(f32 *)&pSVar32[4].TextureMatrix;
          fVar12 = *(f32 *)((long)&pSVar32[4].TextureMatrix + 4);
          uVar13 = *(undefined4 *)&pSVar32[5].Texture;
          fVar14 = *(f32 *)((long)&pSVar32[5].Texture + 4);
          fVar15 = *(f32 *)&pSVar32[5].field_0x8;
          fVar16 = (f32)pSVar32[5].MinFilter;
          (this_00->Material).ZBuffer = (char)uVar13;
          (this_00->Material).AntiAliasing = (char)((uint)uVar13 >> 8);
          *(short *)&(this_00->Material).field_0xa2 = (short)((uint)uVar13 >> 0x10);
          (this_00->Material).BlendFactor = fVar14;
          (this_00->Material).PolygonOffsetDepthBias = fVar15;
          (this_00->Material).PolygonOffsetSlopeScale = fVar16;
          (this_00->Material).SpecularColor.color = EVar9;
          (this_00->Material).Shininess = fVar10;
          (this_00->Material).MaterialTypeParam = fVar11;
          (this_00->Material).Thickness = fVar12;
          (this_00->Material).MaterialType = EVar5;
          (this_00->Material).AmbientColor.color = uVar6;
          (this_00->Material).DiffuseColor.color = uVar7;
          (this_00->Material).EmissiveColor.color = EVar8;
          uVar30 = (**(code **)(*plVar31 + 0x28))(plVar31);
          core::array<irr::video::S3DVertex2TCoords>::reallocate
                    ((array<irr::video::S3DVertex2TCoords> *)&this_00->Vertices,uVar30,true);
          __args_00 = (S3DVertex2TCoords *)(**(code **)(*plVar31 + 0x18))(plVar31);
          if (uVar30 != 0) {
            uVar38 = (ulong)uVar30;
            do {
              __position_00._M_current =
                   (S3DVertex2TCoords *)
                   (this_00->Vertices).m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (S3DVertex2TCoords *)
                  (this_00->Vertices).m_data.
                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::
                vector<irr::video::S3DVertex2TCoords,std::allocator<irr::video::S3DVertex2TCoords>>
                ::_M_realloc_insert<irr::video::S3DVertex2TCoords_const&>
                          ((vector<irr::video::S3DVertex2TCoords,std::allocator<irr::video::S3DVertex2TCoords>>
                            *)&this_00->Vertices,__position_00,__args_00);
              }
              else {
                fVar23 = (__args_00->super_S3DVertex).Pos.X;
                fVar24 = (__args_00->super_S3DVertex).Pos.Y;
                uVar4 = *(undefined8 *)&(__args_00->super_S3DVertex).Pos.Z;
                fVar19 = (__args_00->super_S3DVertex).Normal.Y;
                fVar21 = (__args_00->super_S3DVertex).Normal.Z;
                SVar20.color = (__args_00->super_S3DVertex).Color.color;
                fVar22 = (__args_00->super_S3DVertex).TCoords.X;
                vVar17 = __args_00->TCoords2;
                ((__position_00._M_current)->super_S3DVertex).TCoords =
                     (__args_00->super_S3DVertex).TCoords;
                (__position_00._M_current)->TCoords2 = vVar17;
                ((__position_00._M_current)->super_S3DVertex).Normal.Y = fVar19;
                ((__position_00._M_current)->super_S3DVertex).Normal.Z = fVar21;
                ((__position_00._M_current)->super_S3DVertex).Color = (SColor)SVar20.color;
                ((__position_00._M_current)->super_S3DVertex).TCoords.X = fVar22;
                ((__position_00._M_current)->super_S3DVertex).Pos.X = fVar23;
                ((__position_00._M_current)->super_S3DVertex).Pos.Y = fVar24;
                *(undefined8 *)&((__position_00._M_current)->super_S3DVertex).Pos.Z = uVar4;
                ppSVar1 = &(this_00->Vertices).m_data.
                           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = (pointer)&(*ppSVar1)[1].Pos.Z;
              }
              (this_00->Vertices).is_sorted = false;
              __args_00 = __args_00 + 1;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          uVar30 = (**(code **)(*plVar31 + 0x48))(plVar31);
          core::array<unsigned_short>::reallocate(&this_00->Indices,uVar30,true);
          puVar33 = (unsigned_short *)(**(code **)(*plVar31 + 0x38))(plVar31);
          if (uVar30 != 0) {
            uVar38 = (ulong)uVar30;
            do {
              iVar3._M_current =
                   (this_00->Indices).m_data.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this_00->Indices).m_data.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                           &this_00->Indices,iVar3,puVar33);
              }
              else {
                *iVar3._M_current = *puVar33;
                (this_00->Indices).m_data.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              (this_00->Indices).is_sorted = false;
              puVar33 = puVar33 + 1;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          goto LAB_001c4499;
        }
        if (iVar29 == 0) {
          this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
          CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(this_00);
          pSVar32 = (SMaterialLayer *)(**(code **)(*plVar31 + 8))(plVar31);
          lVar40 = 4;
          pSVar36 = pSVar32;
          pCVar35 = this_00;
          do {
            pCVar35 = (CMeshBuffer<irr::video::S3DVertex> *)&pCVar35->Material;
            video::SMaterialLayer::operator=((SMaterialLayer *)pCVar35,pSVar36);
            pSVar36 = pSVar36 + 1;
            lVar40 = lVar40 + -1;
          } while (lVar40 != 0);
          *(short *)&(this_00->Material).field_0xb0 = (short)pSVar32[5].MagFilter;
          EVar5 = *(E_MATERIAL_TYPE *)&pSVar32[4].Texture;
          uVar6 = *(u32 *)((long)&pSVar32[4].Texture + 4);
          uVar7 = *(u32 *)&pSVar32[4].field_0x8;
          EVar8 = pSVar32[4].MinFilter;
          EVar9 = pSVar32[4].MagFilter;
          fVar10 = *(f32 *)&pSVar32[4].AnisotropicFilter;
          fVar11 = *(f32 *)&pSVar32[4].TextureMatrix;
          fVar12 = *(f32 *)((long)&pSVar32[4].TextureMatrix + 4);
          uVar13 = *(undefined4 *)&pSVar32[5].Texture;
          fVar14 = *(f32 *)((long)&pSVar32[5].Texture + 4);
          fVar15 = *(f32 *)&pSVar32[5].field_0x8;
          fVar16 = (f32)pSVar32[5].MinFilter;
          (this_00->Material).ZBuffer = (char)uVar13;
          (this_00->Material).AntiAliasing = (char)((uint)uVar13 >> 8);
          *(short *)&(this_00->Material).field_0xa2 = (short)((uint)uVar13 >> 0x10);
          (this_00->Material).BlendFactor = fVar14;
          (this_00->Material).PolygonOffsetDepthBias = fVar15;
          (this_00->Material).PolygonOffsetSlopeScale = fVar16;
          (this_00->Material).SpecularColor.color = EVar9;
          (this_00->Material).Shininess = fVar10;
          (this_00->Material).MaterialTypeParam = fVar11;
          (this_00->Material).Thickness = fVar12;
          (this_00->Material).MaterialType = EVar5;
          (this_00->Material).AmbientColor.color = uVar6;
          (this_00->Material).DiffuseColor.color = uVar7;
          (this_00->Material).EmissiveColor.color = EVar8;
          uVar30 = (**(code **)(*plVar31 + 0x28))(plVar31);
          core::array<irr::video::S3DVertex>::reallocate(&this_00->Vertices,uVar30,true);
          __args = (S3DVertex *)(**(code **)(*plVar31 + 0x18))(plVar31);
          if (uVar30 != 0) {
            uVar38 = (ulong)uVar30;
            do {
              __position._M_current =
                   (this_00->Vertices).m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this_00->Vertices).m_data.
                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<irr::video::S3DVertex,std::allocator<irr::video::S3DVertex>>::
                _M_realloc_insert<irr::video::S3DVertex_const&>
                          ((vector<irr::video::S3DVertex,std::allocator<irr::video::S3DVertex>> *)
                           &this_00->Vertices,__position,__args);
              }
              else {
                ((__position._M_current)->TCoords).Y = (__args->TCoords).Y;
                fVar22 = (__args->Pos).X;
                fVar23 = (__args->Pos).Y;
                uVar4 = *(undefined8 *)&(__args->Pos).Z;
                fVar19 = (__args->Normal).Z;
                SVar20.color = (__args->Color).color;
                fVar21 = (__args->TCoords).X;
                ((__position._M_current)->Normal).Y = (__args->Normal).Y;
                ((__position._M_current)->Normal).Z = fVar19;
                (__position._M_current)->Color = (SColor)SVar20.color;
                ((__position._M_current)->TCoords).X = fVar21;
                ((__position._M_current)->Pos).X = fVar22;
                ((__position._M_current)->Pos).Y = fVar23;
                *(undefined8 *)&((__position._M_current)->Pos).Z = uVar4;
                ppSVar1 = &(this_00->Vertices).m_data.
                           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + 1;
              }
              (this_00->Vertices).is_sorted = false;
              __args = __args + 1;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          uVar30 = (**(code **)(*plVar31 + 0x48))(plVar31);
          core::array<unsigned_short>::reallocate(&this_00->Indices,uVar30,true);
          puVar33 = (unsigned_short *)(**(code **)(*plVar31 + 0x38))(plVar31);
          if (uVar30 != 0) {
            uVar38 = (ulong)uVar30;
            do {
              iVar3._M_current =
                   (this_00->Indices).m_data.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this_00->Indices).m_data.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                           &this_00->Indices,iVar3,puVar33);
              }
              else {
                *iVar3._M_current = *puVar33;
                (this_00->Indices).m_data.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              (this_00->Indices).is_sorted = false;
              puVar33 = puVar33 + 1;
              uVar38 = uVar38 - 1;
            } while (uVar38 != 0);
          }
          goto LAB_001c4499;
        }
      }
      uVar30 = (int)uVar39 + 1;
      uVar39 = (ulong)uVar30;
    } while (uVar30 != local_44);
  }
  iVar29 = (*mesh->_vptr_IMesh[3])(mesh);
  puVar34 = (undefined8 *)CONCAT44(extraout_var_00,iVar29);
  uVar4 = *puVar34;
  uVar18 = puVar34[1];
  (local_38->MinEdge).X = (float)(int)uVar4;
  (local_38->MinEdge).Y = (float)(int)((ulong)uVar4 >> 0x20);
  *(undefined8 *)&(local_38->MinEdge).Z = uVar18;
  uVar4 = puVar34[2];
  (local_38->MaxEdge).Y = (float)(int)uVar4;
  (local_38->MaxEdge).Z = (float)(int)((ulong)uVar4 >> 0x20);
  return local_40;
}

Assistant:

SMesh *CMeshManipulator::createMeshCopy(scene::IMesh *mesh) const
{
	if (!mesh)
		return 0;

	SMesh *clone = new SMesh();

	const u32 meshBufferCount = mesh->getMeshBufferCount();

	for (u32 b = 0; b < meshBufferCount; ++b) {
		const IMeshBuffer *const mb = mesh->getMeshBuffer(b);
		switch (mb->getVertexType()) {
		case video::EVT_STANDARD: {
			SMeshBuffer *buffer = new SMeshBuffer();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertex *vertices = (video::S3DVertex *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		case video::EVT_2TCOORDS: {
			SMeshBufferLightMap *buffer = new SMeshBufferLightMap();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertex2TCoords *vertices = (video::S3DVertex2TCoords *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		case video::EVT_TANGENTS: {
			SMeshBufferTangents *buffer = new SMeshBufferTangents();
			buffer->Material = mb->getMaterial();
			const u32 vcount = mb->getVertexCount();
			buffer->Vertices.reallocate(vcount);
			video::S3DVertexTangents *vertices = (video::S3DVertexTangents *)mb->getVertices();
			for (u32 i = 0; i < vcount; ++i)
				buffer->Vertices.push_back(vertices[i]);
			const u32 icount = mb->getIndexCount();
			buffer->Indices.reallocate(icount);
			const u16 *indices = mb->getIndices();
			for (u32 i = 0; i < icount; ++i)
				buffer->Indices.push_back(indices[i]);
			clone->addMeshBuffer(buffer);
			buffer->drop();
		} break;
		} // end switch

	} // end for all mesh buffers

	clone->BoundingBox = mesh->getBoundingBox();
	return clone;
}